

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

hash_t __thiscall
TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::CountUsed
          (TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_> *this)

{
  hash_t hVar1;
  hash_t hVar2;
  Node *pNVar3;
  
  hVar1 = this->Size;
  if (hVar1 == 0) {
    hVar2 = 0;
  }
  else {
    pNVar3 = this->Nodes;
    hVar2 = 0;
    do {
      hVar2 = hVar2 + (pNVar3->Next != (Node *)0x1);
      pNVar3 = pNVar3 + 1;
      hVar1 = hVar1 - 1;
    } while (hVar1 != 0);
  }
  if (hVar2 != this->NumUsed) {
    __assert_fail("used == NumUsed",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                  ,0x2ba,
                  "hash_t TMap<int, FName>::CountUsed() const [KT = int, VT = FName, HashTraits = THashTraits<int>, ValueTraits = TValueTraits<FName>]"
                 );
  }
  return this->NumUsed;
}

Assistant:

hash_t CountUsed() const
	{
#ifdef _DEBUG
		hash_t used = 0;
		hash_t ct = Size;
		for (Node *n = Nodes; ct-- > 0; ++n)
		{
			if (!n->IsNil())
			{
				++used;
			}
		}
		assert (used == NumUsed);
#endif
		return NumUsed;
	}